

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O0

void __thiscall
miniros::Subscription::removePublisherLink(Subscription *this,PublisherLinkPtr *pub_link)

{
  bool bVar1;
  element_type *this_00;
  __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
  in_RDI;
  iterator it;
  scoped_lock<std::mutex> lock;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffff80;
  shared_ptr<miniros::PublisherLink> *in_stack_ffffffffffffff88;
  const_iterator __first;
  
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff80,
             (mutex_type *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  __first._M_current =
       (shared_ptr<miniros::PublisherLink> *)
       &in_RDI._M_current[0x16].
        super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::
  vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
  ::begin((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
           *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  std::
  vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
  ::end((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
         *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  std::
  find<__gnu_cxx::__normal_iterator<std::shared_ptr<miniros::PublisherLink>*,std::vector<std::shared_ptr<miniros::PublisherLink>,std::allocator<std::shared_ptr<miniros::PublisherLink>>>>,std::shared_ptr<miniros::PublisherLink>>
            ((__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
              )__first._M_current,in_RDI,in_stack_ffffffffffffff88);
  std::
  vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
  ::end((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
         *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                      *)in_stack_ffffffffffffff80,
                     (__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  if (bVar1) {
    in_stack_ffffffffffffff80 =
         (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)in_RDI._M_current + 0x168);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::PublisherLink>const*,std::vector<std::shared_ptr<miniros::PublisherLink>,std::allocator<std::shared_ptr<miniros::PublisherLink>>>>
    ::__normal_iterator<std::shared_ptr<miniros::PublisherLink>*>
              ((__normal_iterator<const_std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                *)in_stack_ffffffffffffff80,
               (__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    std::
    vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ::erase((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
             *)in_RDI._M_current,__first);
  }
  this_00 = std::
            __shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x4d77b1);
  bVar1 = PublisherLink::isLatched(this_00);
  if (bVar1) {
    std::
    map<std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo,_std::less<std::shared_ptr<miniros::PublisherLink>_>,_std::allocator<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>_>
    ::erase((map<std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo,_std::less<std::shared_ptr<miniros::PublisherLink>_>,_std::allocator<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>_>
             *)in_stack_ffffffffffffff80,(key_type *)CONCAT17(bVar1,in_stack_ffffffffffffff78));
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4d77ed);
  return;
}

Assistant:

void Subscription::removePublisherLink(const PublisherLinkPtr& pub_link)
{
  std::scoped_lock<std::mutex> lock(publisher_links_mutex_);

  V_PublisherLink::iterator it = std::find(publisher_links_.begin(), publisher_links_.end(), pub_link);
  if (it != publisher_links_.end())
  {
    publisher_links_.erase(it);
  }

  if (pub_link->isLatched())
  {
    latched_messages_.erase(pub_link);
  }
}